

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O3

TokenInfo * __thiscall Lexer::token(Lexer *this)

{
  TokenInfo *pTVar1;
  _Map_pointer ppTVar2;
  _Map_pointer ppTVar3;
  bool bVar4;
  bool local_a;
  bool local_9;
  
  pTVar1 = (this->m_tokenPosition)._M_cur;
  ppTVar2 = (this->m_tokenPosition)._M_node;
  ppTVar3 = (this->m_tokens)._deque.
            super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  bVar4 = ppTVar2 < ppTVar3;
  if (ppTVar2 == ppTVar3) {
    bVar4 = pTVar1 < (this->m_tokens)._deque.
                     super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
  }
  if (bVar4) {
    ppTVar3 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    bVar4 = ppTVar3 <= ppTVar2;
    if (ppTVar2 == ppTVar3) {
      bVar4 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur <= pTVar1;
    }
    if (bVar4) {
      return pTVar1;
    }
  }
  local_9 = false;
  local_a = true;
  error<bool,bool>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/lexer.h:86: hasValidToken() (%1) does not equal true (%2)"
                   ,&local_9,&local_a);
  return (this->m_tokenPosition)._M_cur;
}

Assistant:

inline TokenInfo* token() const
	{
		ASSERT (hasValidToken());
		return &(*m_tokenPosition);
	}